

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O3

stbtt__buf stbtt__get_subrs(stbtt__buf cff,stbtt__buf fontdict)

{
  uint uVar1;
  undefined8 in_RSI;
  int iVar2;
  long in_RDI;
  stbtt__buf sVar3;
  stbtt_uint32 subrsoff;
  stbtt_uint32 private_loc [2];
  stbtt_uint32 local_54;
  stbtt__buf local_50;
  undefined8 local_40;
  stbtt__buf local_38;
  stbtt__buf local_28;
  
  iVar2 = (int)((ulong)in_RSI >> 0x20);
  local_54 = 0;
  local_40 = 0;
  local_50.size = iVar2;
  stbtt__dict_get_ints(&local_28,0x12,2,(stbtt_uint32 *)&local_40);
  uVar1 = local_40._4_4_;
  sVar3 = (stbtt__buf)ZEXT816(0);
  if ((uint)local_40 != 0 && (ulong)local_40._4_4_ != 0) {
    if ((int)((uint)local_40 | local_40._4_4_) < 0) {
      local_38.data = (uchar *)0x0;
      local_38._8_8_ = 0;
    }
    else {
      local_38.data = (uchar *)0x0;
      local_38._8_8_ = 0;
      if ((int)(uint)local_40 <= (int)(iVar2 - local_40._4_4_) && (int)local_40._4_4_ <= iVar2) {
        local_38.data = (uchar *)(in_RDI + (ulong)local_40._4_4_);
        local_38._8_8_ = local_40 << 0x20;
      }
    }
    stbtt__dict_get_ints(&local_38,0x13,1,&local_54);
    if (local_54 == 0) {
      sVar3 = (stbtt__buf)ZEXT416(0);
    }
    else {
      local_50.cursor = local_54 + uVar1;
      if ((local_50.cursor < 0) || (iVar2 < local_50.cursor)) {
        __assert_fail("!(o > b->size || o < 0)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/sienkiewiczkm[P]arealights/dependencies/imgui/stb_truetype.h"
                      ,1000,"void stbtt__buf_seek(stbtt__buf *, int)");
      }
      sVar3 = stbtt__cff_get_index(&local_50);
    }
  }
  return sVar3;
}

Assistant:

static stbtt__buf stbtt__get_subrs(stbtt__buf cff, stbtt__buf fontdict)
{
   stbtt_uint32 subrsoff = 0, private_loc[2] = { 0, 0 };
   stbtt__buf pdict;
   stbtt__dict_get_ints(&fontdict, 18, 2, private_loc);
   if (!private_loc[1] || !private_loc[0]) return stbtt__new_buf(NULL, 0);
   pdict = stbtt__buf_range(&cff, private_loc[1], private_loc[0]);
   stbtt__dict_get_ints(&pdict, 19, 1, &subrsoff);
   if (!subrsoff) return stbtt__new_buf(NULL, 0);
   stbtt__buf_seek(&cff, private_loc[1]+subrsoff);
   return stbtt__cff_get_index(&cff);
}